

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       map_caster<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>,long,long>
       ::
       cast<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>const&>
                 (SequenceDistanceGraph *src,return_value_policy policy,handle parent)

{
  pointer *ppvVar1;
  handle hVar2;
  object key;
  dict d;
  object value;
  handle local_60;
  object local_58;
  object local_50;
  item_accessor local_48;
  
  dict::dict((dict *)&local_58);
  ppvVar1 = &(src->super_DistanceGraph).links.
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    hVar2 = local_58.super_handle.m_ptr;
    ppvVar1 = (pointer *)*ppvVar1;
    if (ppvVar1 == (pointer *)0x0) {
      local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_002082fa:
      object::~object(&local_58);
      return (handle)hVar2.m_ptr;
    }
    local_60.m_ptr = (PyObject *)PyLong_FromSsize_t((pointer)ppvVar1[1]);
    local_50.super_handle.m_ptr = (handle)PyLong_FromSsize_t((pointer)ppvVar1[2]);
    if ((local_60.m_ptr == (PyObject *)0x0) || (local_50.super_handle.m_ptr == (PyObject *)0x0)) {
      object::~object(&local_50);
      object::~object((object *)&local_60);
      hVar2.m_ptr = (PyObject *)0x0;
      goto LAB_002082fa;
    }
    object_api<pybind11::handle>::operator[]
              (&local_48,(object_api<pybind11::handle> *)&local_58,local_60);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_48,&local_50);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_48);
    object::~object(&local_50);
    object::~object((object *)&local_60);
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }